

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

QPDFObjectHandle __thiscall
NNTreeIterator::getNextKid(NNTreeIterator *this,PathElement *pe,bool backward)

{
  int iVar1;
  NNTreeImpl *pNVar2;
  uint __val;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  string *key;
  long *plVar11;
  int in_ECX;
  ulong uVar12;
  element_type *peVar13;
  undefined7 in_register_00000011;
  string *key_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  bool bVar15;
  uint __len;
  uint uVar16;
  QPDFObjectHandle QVar17;
  string __str;
  QPDFObjectHandle kids;
  undefined1 local_c8 [40];
  NNTreeIterator *local_a0;
  uint local_94;
  PathElement *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_88 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78 [2];
  QPDFObjectHandle local_68;
  string local_58;
  QPDF *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  
  key_00 = (string *)CONCAT71(in_register_00000011,backward);
  this->_vptr_NNTreeIterator = (_func_int **)0x0;
  this->impl = (NNTreeImpl *)0x0;
  uVar16 = -in_ECX | 1;
  local_a0 = this;
  local_94 = uVar16;
  local_90 = pe;
  bVar15 = false;
  do {
    *(uint *)&key_00->field_2 = *(int *)&key_00->field_2 + uVar16;
    local_c8._0_8_ = (element_type *)(local_c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Kids","");
    QPDFObjectHandle::getKey(&local_68,key_00);
    if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    iVar1 = *(int *)&key_00->field_2;
    if ((iVar1 < 0) || (iVar9 = QPDFObjectHandle::getArrayNItems(&local_68), iVar9 <= iVar1)) {
      QVar17 = QPDFObjectHandle::newNull();
      uVar4 = local_c8._8_8_;
      uVar3 = local_c8._0_8_;
      _Var14._M_pi = QVar17.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (NNTreeImpl *)0x0;
      pNVar2 = this->impl;
      this->_vptr_NNTreeIterator = (_func_int **)uVar3;
      this->impl = (NNTreeImpl *)uVar4;
      if (pNVar2 != (NNTreeImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar2);
        _Var14._M_pi = extraout_RDX_02;
      }
      if ((NNTreeImpl *)local_c8._8_8_ != (NNTreeImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        _Var14._M_pi = extraout_RDX_03;
      }
      bVar6 = true;
    }
    else {
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_c8,(int)&local_68);
      uVar4 = local_c8._8_8_;
      uVar3 = local_c8._0_8_;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (NNTreeImpl *)0x0;
      pNVar2 = this->impl;
      this->_vptr_NNTreeIterator = (_func_int **)uVar3;
      this->impl = (NNTreeImpl *)uVar4;
      if (pNVar2 != (NNTreeImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pNVar2);
      }
      if ((NNTreeImpl *)local_c8._8_8_ != (NNTreeImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      bVar6 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
      if (bVar6) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"/Kids","");
        bVar7 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,&local_58);
        bVar8 = true;
        _Var14._M_pi = extraout_RDX_00;
        if (!bVar7) {
          key = (string *)
                (**(code **)*((local_90->node).super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_vptr__Sp_counted_base)();
          bVar8 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)this,key);
          _Var14._M_pi = extraout_RDX_01;
        }
      }
      else {
        bVar8 = false;
        _Var14._M_pi = extraout_RDX;
      }
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2)) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        _Var14._M_pi = extraout_RDX_05;
      }
      bVar6 = true;
      if (bVar8 == false) {
        uVar16 = *(uint *)&key_00->field_2;
        __val = -uVar16;
        if (0 < (int)uVar16) {
          __val = uVar16;
        }
        __len = 1;
        if (9 < __val) {
          uVar12 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar10 = (uint)uVar12;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0012aa98;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0012aa98;
            }
            if (uVar10 < 10000) goto LAB_0012aa98;
            uVar12 = uVar12 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0012aa98:
        local_38 = *(QPDF **)&((local_90->node).super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_M_use_count;
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct
                  ((ulong)local_88,(char)__len - (char)((int)uVar16 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)&local_88[0]->_M_pi + (ulong)(uVar16 >> 0x1f)),__len,__val);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x261178);
        uVar16 = local_94;
        this = local_a0;
        peVar13 = (element_type *)(plVar11 + 2);
        if ((element_type *)*plVar11 == peVar13) {
          local_c8._16_8_ =
               *(undefined8 *)
                &(peVar13->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_c8._24_8_ = plVar11[3];
          local_c8._0_8_ = (element_type *)(local_c8 + 0x10);
        }
        else {
          local_c8._16_8_ =
               *(undefined8 *)
                &(peVar13->value).
                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 .
                 super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
          ;
          local_c8._0_8_ = (element_type *)*plVar11;
        }
        local_c8._8_8_ = plVar11[1];
        *plVar11 = (long)peVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        warn(local_38,(QPDFObjectHandle *)key_00,(string *)local_c8);
        _Var14._M_pi = extraout_RDX_06;
        if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
          _Var14._M_pi = extraout_RDX_07;
        }
        bVar6 = bVar15;
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],
                          (ulong)((long)&(local_78[0]._M_pi)->_vptr__Sp_counted_base + 1));
          _Var14._M_pi = extraout_RDX_08;
        }
      }
    }
    if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      _Var14._M_pi = extraout_RDX_04;
    }
    bVar15 = bVar6;
    if (bVar6) {
      QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var14._M_pi;
      QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)this;
      return (QPDFObjectHandle)
             QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

QPDFObjectHandle
NNTreeIterator::getNextKid(PathElement& pe, bool backward)
{
    QPDFObjectHandle result;
    bool found = false;
    while (!found) {
        pe.kid_number += backward ? -1 : 1;
        auto kids = pe.node.getKey("/Kids");
        if ((pe.kid_number >= 0) && (pe.kid_number < kids.getArrayNItems())) {
            result = kids.getArrayItem(pe.kid_number);
            if (result.isDictionary() &&
                (result.hasKey("/Kids") || result.hasKey(impl.details.itemsKey()))) {
                found = true;
            } else {
                QTC::TC("qpdf", "NNTree skip invalid kid");
                warn(
                    impl.qpdf,
                    pe.node,
                    ("skipping over invalid kid at index " + std::to_string(pe.kid_number)));
            }
        } else {
            result = QPDFObjectHandle::newNull();
            found = true;
        }
    }
    return result;
}